

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_check_utf8(uchar *state,uchar *buf,size_t len)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  
  bVar4 = *state;
  sVar3 = 0;
  do {
    if (len == sVar3) {
      *state = bVar4;
      return 0;
    }
    bVar1 = buf[sVar3];
    if (bVar4 == 0) {
      bVar2 = true;
      if ((char)bVar1 < '\0') {
        bVar4 = 0;
        bVar2 = false;
        if (0xcc < (byte)(bVar1 + 0xb)) {
          bVar4 = 0x8c;
          bVar2 = true;
          if (0xdf < bVar1) {
            uVar5 = bVar1 & 0x1f;
            goto LAB_00103a70;
          }
        }
      }
      else {
        bVar4 = 0;
      }
    }
    else {
      uVar5 = bVar4 & 0xfffffff0;
      if ((uVar5 < bVar1 || uVar5 == bVar1) && ((uint)bVar1 < uVar5 + (bVar4 & 0xc) * 4 + 0x10)) {
        uVar5 = (bVar4 & 3) + 0x15;
LAB_00103a70:
        bVar4 = e0f4[uVar5];
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    sVar3 = sVar3 + 1;
    if (!bVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

int
lws_check_utf8(unsigned char *state, unsigned char *buf, size_t len)
{
	unsigned char s = *state;

	while (len--) {
		unsigned char c = *buf++;

		if (!s) {
			if (c >= 0x80) {
				if (c < 0xc2 || c > 0xf4)
					return 1;
				if (c < 0xe0)
					s = 0x80 | ((4 - 1) << 2);
				else
					s = e0f4[c - 0xe0];
			}
		} else {
			if (c < (s & 0xf0) ||
			    c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
				return 1;
			s = e0f4[21 + (s & 3)];
		}
	}

	*state = s;

	return 0;
}